

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qproperty.cpp
# Opt level: O1

void __thiscall
QtPrivate::QPropertyBindingData::notifyObservers
          (QPropertyBindingData *this,QUntypedPropertyData *propertyDataPtr,QBindingStorage *storage
          )

{
  QPropertyBindingPrivatePtr *pQVar1;
  code *pcVar2;
  ulong uVar3;
  undefined8 uVar4;
  NotificationResult NVar5;
  QPropertyObserverPointer observer;
  QPropertyBindingData *pQVar6;
  ulong uVar7;
  long lVar8;
  QPropertyBindingPrivatePtr *this_00;
  QPropertyObserver *otherT_1;
  ulong *puVar9;
  quintptr dd;
  ulong *puVar10;
  QTaggedPointer<QPropertyObserver,_QPropertyObserverBase::ObserverTag> QVar11;
  quintptr *d;
  long lVar12;
  long in_FS_OFFSET;
  PendingBindingObserverList bindingObservers;
  QPropertyObserver local_868;
  QPropertyObserverPointer local_850;
  undefined1 local_848 [2072];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  observer.ptr = (QPropertyObserver *)this->d_ptr;
  if (((ulong)observer.ptr & 2) == 0) {
    memset(local_848,0xaa,0x818);
    local_848._0_8_ = 0x100;
    local_848._8_8_ = 0;
    pQVar1 = (QPropertyBindingPrivatePtr *)(local_848 + 0x18);
    if (observer.ptr != (QPropertyObserver *)0x1 && ((ulong)observer.ptr & 1) != 0) {
      observer.ptr = *(QPropertyObserver **)
                      ((long)&observer.ptr[4].super_QPropertyObserverBase.field_2 + 7);
    }
    local_848._16_8_ = pQVar1;
    if ((observer.ptr != (QPropertyObserver *)0x0) &&
       (NVar5 = notifyObserver_helper
                          (this,propertyDataPtr,storage,observer,
                           (PendingBindingObserverList *)local_848), NVar5 != Delayed)) {
      if (storage != (QBindingStorage *)0x0) {
        local_868.super_QPropertyObserverBase.next.d = (quintptr)storage;
        this = QBindingStoragePrivate::get((QBindingStoragePrivate *)&local_868,propertyDataPtr);
      }
      pQVar6 = (QPropertyBindingData *)(this->d_ptr & 0xfffffffffffffffc);
      if ((this->d_ptr & 2) == 0) {
        pQVar6 = this;
      }
      puVar9 = (ulong *)pQVar6->d_ptr;
      if (puVar9 != (ulong *)0x1 && ((ulong)puVar9 & 1) != 0) {
        puVar9 = *(ulong **)((long)puVar9 + 0x77);
      }
      if (puVar9 != (ulong *)0x0) {
        do {
          puVar10 = (ulong *)(*puVar9 & 0xfffffffffffffff8);
          if (((uint)*puVar9 & 7) == 1) {
            pcVar2 = (code *)puVar9[2];
            if ((puVar10 == (ulong *)0x0) || (QVar11.d = *puVar10, ((uint)QVar11.d & 7) != 2)) {
              local_868.super_QPropertyObserverBase.field_2.binding = (QPropertyBindingPrivate *)0x0
              ;
              uVar3 = *puVar9;
              *puVar9 = (ulong)((uint)*puVar9 & 7) | (ulong)&local_868;
              uVar7 = uVar3 & 0xfffffffffffffff8;
              if (uVar7 != 0) {
                *(QPropertyObserver **)(uVar7 + 8) = &local_868;
              }
              local_868.super_QPropertyObserverBase.next.d = uVar3 & 0xfffffffffffffff8 | 2;
              local_868.super_QPropertyObserverBase.prev.d = puVar9;
              (*pcVar2)();
              QVar11.d = local_868.super_QPropertyObserverBase.next.d;
              local_850.ptr = &local_868;
              QPropertyObserverPointer::unlink_common(&local_850);
            }
            puVar10 = (ulong *)(QVar11.d & 0xfffffffffffffff8);
          }
          puVar9 = puVar10;
        } while (puVar9 != (ulong *)0x0);
      }
      uVar4 = local_848._16_8_;
      if (local_848._8_8_ != 0) {
        lVar8 = local_848._8_8_ << 3;
        lVar12 = 0;
        do {
          QPropertyBindingPrivate::notifyNonRecursive
                    (*(QPropertyBindingPrivate **)((long)(RefCounted **)uVar4 + lVar12));
          lVar12 = lVar12 + 8;
        } while (lVar8 != lVar12);
      }
    }
    if (0 < (long)local_848._8_8_) {
      lVar8 = local_848._8_8_ + 1;
      this_00 = (QPropertyBindingPrivatePtr *)local_848._16_8_;
      do {
        QPropertyBindingPrivatePtr::~QPropertyBindingPrivatePtr(this_00);
        this_00 = this_00 + 1;
        lVar8 = lVar8 + -1;
      } while (1 < lVar8);
    }
    if ((QPropertyBindingPrivatePtr *)local_848._16_8_ != pQVar1) {
      sizedFree((void *)local_848._16_8_,local_848._0_8_ << 3);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPropertyBindingData::notifyObservers(QUntypedPropertyData *propertyDataPtr, QBindingStorage *storage) const
{
    if (isNotificationDelayed())
        return;
    QPropertyBindingDataPointer d{this};

    PendingBindingObserverList bindingObservers;
    if (QPropertyObserverPointer observer = d.firstObserver()) {
        if (notifyObserver_helper(propertyDataPtr, storage, observer, bindingObservers) == Evaluated) {
            /* evaluateBindings() can trash the observers. We need to re-fetch here.
             "this" might also no longer be valid in case we have a QObjectBindableProperty
             and consequently d isn't either (this happens when binding evaluation has
             caused the binding storage to resize.
             If storage is nullptr, then there is no dynamically resizable storage,
             and we cannot run into the issue.
            */
            if (storage)
                d = QPropertyBindingDataPointer {storage->bindingData(propertyDataPtr)};
            if (QPropertyObserverPointer observer = d.firstObserver())
                observer.notify(propertyDataPtr);
            for (auto &&bindingPtr: bindingObservers) {
                auto *binding = static_cast<QPropertyBindingPrivate *>(bindingPtr.get());
                binding->notifyNonRecursive();
            }
        }
    }
}